

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_interpolation_error2(REF_GRID ref_grid,REF_DBL *scalar)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_DBL *scalar_00;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT new_cell;
  REF_INT tri_nodes [27];
  REF_CELL tri_cell;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_DBL *dist;
  REF_DBL error;
  REF_DBL integral;
  REF_DBL node_area [7];
  REF_STATUS local_a8;
  REF_INT local_a4;
  REF_INT nodes [27];
  int local_34;
  REF_INT cell_node;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *scalar_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[4];
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xe9d,
           "ref_metric_interpolation_error2","malloc dist of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    scalar_00 = (REF_DBL *)malloc((long)ref_node_00->max << 3);
    if (scalar_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xe9d,"ref_metric_interpolation_error2","malloc dist of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_node_00->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        scalar_00[ref_private_macro_code_rss_1] = 0.0;
      }
      dist = (REF_DBL *)0x0;
      for (local_34 = 0; local_34 < ref_cell_00->max; local_34 = local_34 + 1) {
        RVar1 = ref_cell_nodes(ref_cell_00,local_34,&local_a8);
        if (RVar1 == 0) {
          for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->node_per; nodes[0x1a] = nodes[0x1a] + 1)
          {
            node_area[(long)nodes[0x1a] + -1] = scalar[(&local_a8)[nodes[0x1a]]];
          }
          uVar2 = ref_node_tri_area(ref_node_00,&local_a8,node_area + 5);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xea3,"ref_metric_interpolation_error2",(ulong)uVar2,"area");
            return uVar2;
          }
          uVar2 = ref_metric_integrate2(ref_metric_integrand_quad_err2,&integral,&error);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xea6,"ref_metric_interpolation_error2",(ulong)uVar2,"intg");
            return uVar2;
          }
          dist = (REF_DBL *)(error + (double)dist);
          unique0x00012000 = ref_grid->cell[3];
          ref_private_macro_code_rss_2 = local_a8;
          new_cell = local_a4;
          tri_nodes[0] = nodes[0];
          tri_nodes[1] = nodes[4];
          uVar2 = ref_cell_add(unique0x00012000,&ref_private_macro_code_rss_2,
                               &ref_private_macro_code_rss_3);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xeaf,"ref_metric_interpolation_error2",(ulong)uVar2,"add tri");
            return uVar2;
          }
          scalar_00[ref_private_macro_code_rss_2] =
               error / 3.0 + scalar_00[ref_private_macro_code_rss_2];
          scalar_00[new_cell] = error / 3.0 + scalar_00[new_cell];
          scalar_00[tri_nodes[0]] = error / 3.0 + scalar_00[tri_nodes[0]];
        }
      }
      printf("interpolation error %e\n",dist);
      ref_grid_local._4_4_ =
           ref_gather_scalar_by_extension
                     (ref_grid,1,scalar_00,(char **)0x0,"ref_metric_test_dist.plt");
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xeb8,"ref_metric_interpolation_error2",(ulong)ref_grid_local._4_4_,"dump");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolation_error2(REF_GRID ref_grid,
                                                   REF_DBL *scalar) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tr2(ref_grid);
  REF_INT cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL node_area[7];
  REF_DBL integral;
  REF_DBL error;
  REF_DBL *dist;

  ref_malloc_init(dist, ref_node_max(ref_node), REF_DBL, 0.0);
  error = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    each_ref_cell_cell_node(ref_cell, cell_node) {
      node_area[cell_node] = scalar[nodes[cell_node]];
    }
    RSS(ref_node_tri_area(ref_node, nodes, &(node_area[6])), "area");
    RSS(ref_metric_integrate2(ref_metric_integrand_quad_err2, node_area,
                              &integral),
        "intg");
    error += integral;
    {
      REF_CELL tri_cell = ref_grid_tri(ref_grid);
      REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
      tri_nodes[0] = nodes[0];
      tri_nodes[1] = nodes[1];
      tri_nodes[2] = nodes[2];
      tri_nodes[3] = nodes[6];
      RSS(ref_cell_add(tri_cell, tri_nodes, &new_cell), "add tri");
      dist[tri_nodes[0]] += integral / 3.0;
      dist[tri_nodes[1]] += integral / 3.0;
      dist[tri_nodes[2]] += integral / 3.0;
    }
  }
  printf("interpolation error %e\n", error);
  RSS(ref_gather_scalar_by_extension(ref_grid, 1, dist, NULL,
                                     "ref_metric_test_dist.plt"),
      "dump");

  return REF_SUCCESS;
}